

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<long_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,longlong value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t sVar3;
  ulong uVar4;
  CharPtr pwVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar13;
  
  uVar1 = spec._20_4_;
  uVar13 = 0;
  if (value < 0) {
    uVar13 = 0x2d;
    value = -value;
LAB_0016c140:
    uVar10 = 1;
  }
  else {
    uVar10 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar7 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar7 = 0x20;
      }
      uVar13 = (uint)bVar7;
      goto LAB_0016c140;
    }
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0016c402;
      if (spec.type_ != 'B') goto code_r0x0016c597;
    }
    else {
      if (spec.type_ == 'X') {
LAB_0016c387:
        uVar13 = uVar10;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar10] = 0x30;
          uVar13 = uVar10 | 2;
          (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
        }
        uVar10 = 0;
        uVar6 = value;
        do {
          uVar10 = uVar10 + 1;
          bVar12 = 0xf < uVar6;
          uVar6 = uVar6 >> 4;
        } while (bVar12);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar10,&spec,&stack0xffffffffffffffc4,uVar13);
        pcVar8 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar8 = "0123456789abcdef";
        }
        do {
          *pwVar5 = (int)pcVar8[(uint)value & 0xf];
          pwVar5 = pwVar5 + -1;
          bVar12 = 0xf < (ulong)value;
          value = (ulong)value >> 4;
        } while (bVar12);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0016c597;
    }
    uVar13 = uVar10;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      (&stack0xffffffffffffffc4)[uVar10] = 0x30;
      uVar13 = uVar10 | 2;
      (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
    }
    uVar10 = 0;
    uVar6 = value;
    do {
      uVar10 = uVar10 + 1;
      bVar12 = 1 < uVar6;
      uVar6 = uVar6 >> 1;
    } while (bVar12);
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar10,&spec,&stack0xffffffffffffffc4,uVar13);
    do {
      *pwVar5 = (uint)value & 1 | 0x30;
      pwVar5 = pwVar5 + -1;
      bVar12 = 1 < (ulong)value;
      value = (ulong)value >> 1;
    } while (bVar12);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar6 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          (&stack0xffffffffffffffc4)[uVar6] = 0x30;
        }
        uVar13 = 0;
        uVar6 = value;
        do {
          uVar13 = uVar13 + 1;
          bVar12 = 7 < uVar6;
          uVar6 = uVar6 >> 3;
        } while (bVar12);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar13,&spec,&stack0xffffffffffffffc4,uVar10);
        do {
          *pwVar5 = (uint)value & 7 | 0x30;
          pwVar5 = pwVar5 + -1;
          bVar12 = 7 < (ulong)value;
          value = (ulong)value >> 3;
        } while (bVar12);
        return;
      }
      if (spec.type_ == 'x') goto LAB_0016c387;
code_r0x0016c597:
      internal::report_unknown_type
                (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar13,in_stack_ffffffffffffffc0));
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        lVar11 = 0x3f;
        if ((value | 1U) != 0) {
          for (; (value | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = ((uint)lVar11 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
        plVar2 = localeconv();
        pcVar8 = plVar2->thousands_sep;
        sVar3 = strlen(pcVar8);
        uVar13 = uVar13 - ((ulong)value < internal::BasicData<void>::POWERS_OF_10_64[uVar13]);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar13 + (int)sVar3 * (uVar13 / 3) + 1,&spec,
                            &stack0xffffffffffffffc4,uVar10);
        pwVar5 = pwVar5 + 1;
        uVar13 = 0;
        if (99 < (ulong)value) {
          uVar6 = value;
          do {
            uVar10 = uVar13;
            value = uVar6 / 100;
            uVar4 = (ulong)(uint)(((int)uVar6 + (int)value * -100) * 2);
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar4 + 1];
            pwVar5 = pwVar5 + -1;
            if (((uVar10 | 1) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
              lVar9 = 0;
              lVar11 = sVar3 + 1;
              do {
                pwVar5[lVar9] = (int)pcVar8[lVar9];
                lVar11 = lVar11 + -1;
                lVar9 = lVar9 + 1;
              } while (1 < lVar11);
            }
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar4];
            pwVar5 = pwVar5 + -1;
            if (((uVar10 + 2) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
              lVar9 = 0;
              lVar11 = sVar3 + 1;
              do {
                pwVar5[lVar9] = (int)pcVar8[lVar9];
                lVar11 = lVar11 + -1;
                lVar9 = lVar9 + 1;
              } while (1 < lVar11);
            }
            bVar12 = 9999 < uVar6;
            uVar6 = value;
            uVar13 = uVar10 + 2;
          } while (bVar12);
          uVar13 = (uint)(uVar10 * -0x55555555 + 1 < 0x55555556);
        }
        if ((ulong)value < 10) {
          pwVar5[-1] = (uint)value | 0x30;
          return;
        }
        uVar6 = (value & 0xffffffffU) * 2;
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(uVar6 & 0xffffffff) + 1];
        pwVar5 = pwVar5 + -1;
        if (((char)uVar13 != '\0') && (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
          lVar9 = sVar3 + 1;
          lVar11 = 0;
          do {
            pwVar5[lVar11] = (int)pcVar8[lVar11];
            lVar9 = lVar9 + -1;
            lVar11 = lVar11 + 1;
          } while (1 < lVar9);
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar6];
        return;
      }
      goto code_r0x0016c597;
    }
LAB_0016c402:
    lVar11 = 0x3f;
    if ((value | 1U) != 0) {
      for (; (value | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar13 = ((uint)lVar11 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar13 - ((ulong)value <
                                       internal::BasicData<void>::POWERS_OF_10_64[uVar13])) + 1,
                        &spec,&stack0xffffffffffffffc4,uVar10);
    pwVar5 = pwVar5 + 1;
    uVar6 = value;
    if (99 < (ulong)value) {
      do {
        value = uVar6 / 100;
        uVar4 = (ulong)(uint)((int)uVar6 + (int)value * -100);
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar4 * 2 + 1];
        pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar4 * 2];
        pwVar5 = pwVar5 + -2;
        bVar12 = 9999 < uVar6;
        uVar6 = value;
      } while (bVar12);
    }
    if ((ulong)value < 10) {
      pwVar5[-1] = (uint)value | 0x30;
    }
    else {
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((value & 0xffffffffU) * 2 & 0xffffffff) + 1];
      pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(value & 0xffffffffU) * 2];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}